

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane-test.c++:267:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_membrane_test_c__:267:17)>
            *this)

{
  PointerBuilder builder;
  PointerBuilder builder_00;
  Own<capnp::MembranePolicy> *in_R9;
  Orphanage OVar1;
  Orphanage to;
  word local_2d8;
  WirePointer *in_stack_fffffffffffffd40;
  Own<capnp::MembranePolicy> local_2b8;
  PointerBuilder local_2a8;
  undefined1 local_290 [24];
  Builder local_278;
  PointerBuilder local_248;
  capnp local_228 [32];
  MallocMessageBuilder insideBuilder;
  MallocMessageBuilder outsideBuilder;
  
  capnp::MallocMessageBuilder::MallocMessageBuilder(&outsideBuilder,0x400,GROW_HEURISTICALLY);
  capnp::MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)&insideBuilder,&outsideBuilder.super_MessageBuilder);
  local_2a8.segment = (SegmentBuilder *)insideBuilder.super_MessageBuilder._vptr_MessageBuilder;
  local_2a8.capTable = (CapTableBuilder *)insideBuilder.super_MessageBuilder.arenaSpace[0];
  local_2a8.pointer = (WirePointer *)insideBuilder.super_MessageBuilder.arenaSpace[2];
  heap<capnp::_::(anonymous_namespace)::ThingImpl,char_const(&)[7]>((char (*) [7])&insideBuilder);
  capnproto_test::capnp::test::TestMembrane::Thing::Client::
  Client<capnp::_::(anonymous_namespace)::ThingImpl,void>
            ((Client *)local_290,(Own<capnp::_::(anonymous_namespace)::ThingImpl> *)&insideBuilder);
  builder.capTable = local_2a8.capTable;
  builder.segment = local_2a8.segment;
  builder.pointer = local_2a8.pointer;
  capnp::_::PointerHelpers<capnproto_test::capnp::test::TestMembrane::Thing,_(capnp::Kind)5>::set
            (builder,(Client *)local_290);
  Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_290 + 8));
  Own<capnp::_::(anonymous_namespace)::ThingImpl>::~Own
            ((Own<capnp::_::(anonymous_namespace)::ThingImpl> *)&insideBuilder);
  capnp::MallocMessageBuilder::MallocMessageBuilder(&insideBuilder,0x400,GROW_HEURISTICALLY);
  capnp::MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&local_278,&insideBuilder.super_MessageBuilder);
  local_248.segment = local_278._builder.segment;
  local_248.capTable = local_278._builder.capTable;
  local_248.pointer = local_278._builder.pointers;
  capnp::_::PointerBuilder::asReader(&local_2a8);
  OVar1 = capnp::MessageBuilder::getOrphanage(&insideBuilder.super_MessageBuilder);
  (*(((((this->f).env)->policy).ptr)->super_MembranePolicy)._vptr_MembranePolicy[2])(&local_2b8);
  to.capTable = (CapTableBuilder *)&local_2b8;
  to.arena = (BuilderArena *)OVar1.capTable;
  capnp::copyOutOfMembrane<capnp::AnyPointer::Reader>
            ((Orphan<capnp::AnyPointer> *)&local_2d8,local_228,(Reader *)OVar1.arena,to,in_R9);
  capnp::_::PointerBuilder::adopt(&local_248,(OrphanBuilder *)&local_2d8);
  capnp::_::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&local_2d8);
  Own<capnp::MembranePolicy>::dispose(&local_2b8);
  capnp::MessageBuilder::getRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&local_278,&insideBuilder.super_MessageBuilder);
  local_2d8.content = (uint64_t)local_278._builder.segment;
  builder_00.capTable = (CapTableBuilder *)local_278._builder.pointers;
  builder_00.segment = (SegmentBuilder *)local_278._builder.capTable;
  builder_00.pointer = in_stack_fffffffffffffd40;
  capnp::_::PointerHelpers<capnproto_test::capnp::test::TestMembrane::Thing,_(capnp::Kind)5>::get
            (builder_00);
  capnp::MallocMessageBuilder::~MallocMessageBuilder(&insideBuilder);
  capnp::MallocMessageBuilder::~MallocMessageBuilder(&outsideBuilder);
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }